

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,SequentialStmtBlock *stmt)

{
  pointer pEVar1;
  iterator __position;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  pointer pcVar5;
  pointer pEVar6;
  size_type *local_98;
  string cond;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_98 = &cond._M_string_length;
  cond._M_dataplus._M_p = (pointer)0x0;
  cond._M_string_length._0_1_ = 0;
  pEVar6 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  cond.field_2._8_8_ = this;
  if (pEVar6 != pEVar1) {
    do {
      if (pEVar6->edge == Posedge) {
        (*(pEVar6->var->super_IRNode)._vptr_IRNode[0x1f])(local_70);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x24ffc4);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_40 = *plVar3;
          lStack_38 = plVar2[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar3;
          local_50 = (long *)*plVar2;
        }
        local_48 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
      }
      else {
        (*(pEVar6->var->super_IRNode)._vptr_IRNode[0x1f])(local_70);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x247d7f);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_40 = *plVar3;
          lStack_38 = plVar2[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar3;
          local_50 = (long *)*plVar2;
        }
        local_48 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar1);
  }
  uVar4 = 0xcbf29ce484222325;
  if (cond._M_dataplus._M_p == (pointer)0x0) {
    uVar4 = 0xcbf29ce484222325;
  }
  else {
    pcVar5 = (pointer)0x0;
    do {
      uVar4 = (*(byte *)((long)local_98 + (long)pcVar5) ^ uVar4) * 0x100000001b3;
      pcVar5 = pcVar5 + 1;
    } while (cond._M_dataplus._M_p != pcVar5);
  }
  local_50 = (long *)(uVar4 << (*(byte *)(cond.field_2._8_8_ + 8) & 0x3f) ^ 0xf1bbcdcbfa53e0b4);
  __position._M_current = *(unsigned_long **)(cond.field_2._8_8_ + 0x68);
  if (__position._M_current == *(unsigned_long **)(cond.field_2._8_8_ + 0x70)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(cond.field_2._8_8_ + 0x60),
               __position,(unsigned_long *)&local_50);
  }
  else {
    *__position._M_current = (unsigned_long)local_50;
    *(unsigned_long **)(cond.field_2._8_8_ + 0x68) = __position._M_current + 1;
  }
  if (local_98 != &cond._M_string_length) {
    operator_delete(local_98,CONCAT71(cond._M_string_length._1_7_,(undefined1)cond._M_string_length)
                             + 1);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        std::string cond;
        auto const& conditions = stmt->get_event_controls();
        for (auto const& event_control : conditions) {
            if (event_control.edge == EventEdgeType::Posedge)
                cond.append("1" + event_control.var->to_string());
            else
                cond.append("0" + event_control.var->to_string());
        }
        uint64_t hash = hash_64_fnv1a(cond.c_str(), cond.size()) << level;
        constexpr uint64_t seq_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(hash ^ seq_signature);
    }